

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O0

void lysc_range_free(lysf_ctx *ctx,lysc_range *range)

{
  void *local_30;
  void *local_20;
  uint64_t c__;
  lysc_range *range_local;
  lysf_ctx *ctx_local;
  
  if (range->parts != (lysc_range_part *)0x0) {
    free(&range->parts[-1].field_1);
  }
  lydict_remove(ctx->ctx,range->eapptag);
  lydict_remove(ctx->ctx,range->emsg);
  lydict_remove(ctx->ctx,range->dsc);
  lydict_remove(ctx->ctx,range->ref);
  local_20 = (void *)0x0;
  while( true ) {
    if (range->exts == (lysc_ext_instance *)0x0) {
      local_30 = (void *)0x0;
    }
    else {
      local_30 = range->exts[-1].compiled;
    }
    if (local_30 <= local_20) break;
    lysc_ext_instance_free(ctx,range->exts + (long)local_20);
    local_20 = (void *)((long)local_20 + 1);
  }
  if (range->exts != (lysc_ext_instance *)0x0) {
    free(&range->exts[-1].compiled);
  }
  return;
}

Assistant:

static void
lysc_range_free(struct lysf_ctx *ctx, struct lysc_range *range)
{
    LY_ARRAY_FREE(range->parts);
    lydict_remove(ctx->ctx, range->eapptag);
    lydict_remove(ctx->ctx, range->emsg);
    lydict_remove(ctx->ctx, range->dsc);
    lydict_remove(ctx->ctx, range->ref);
    FREE_ARRAY(ctx, range->exts, lysc_ext_instance_free);
}